

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

void __thiscall
cfd::core::Privkey::Privkey(Privkey *this,ByteData *byte_data,NetType net_type,bool is_compressed)

{
  undefined1 uVar1;
  byte bVar2;
  undefined8 uVar3;
  ByteData *in_stack_ffffffffffffff28;
  ByteData *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff40;
  CfdError error_code;
  CfdException *this_00;
  allocator local_a1;
  string local_a0 [32];
  string local_80;
  CfdSourceLocation local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  byte local_1d;
  NetType local_1c;
  bool is_compressed_local;
  ByteData *pBStack_18;
  NetType net_type_local;
  ByteData *byte_data_local;
  Privkey *this_local;
  
  this_00 = (CfdException *)this;
  local_1d = is_compressed;
  local_1c = net_type;
  pBStack_18 = byte_data;
  byte_data_local = &this->data_;
  ByteData::ByteData(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  *(byte *)&(this_00->message_)._M_string_length = local_1d & 1;
  *(NetType *)((long)&(this_00->message_)._M_string_length + 4) = local_1c;
  ByteData::GetBytes(&local_38,(ByteData *)this_00);
  uVar1 = IsValid(&local_38);
  bVar2 = uVar1 ^ 0xff;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             (CONCAT17(uVar1,CONCAT16(uVar1,in_stack_ffffffffffffff40)) ^ 0xff000000000000));
  if ((bVar2 & 1) == 0) {
    return;
  }
  local_60.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_key.cpp"
               ,0x2f);
  local_60.filename = local_60.filename + 1;
  local_60.line = 0xe3;
  local_60.funcname = "Privkey";
  ByteData::GetHex_abi_cxx11_(&local_80,&this->data_);
  error_code = (CfdError)((ulong)this >> 0x20);
  logger::warn<std::__cxx11::string>(&local_60,"Invalid Privkey data. hex={}.",&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  uVar3 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_a0,"Invalid Privkey data.",&local_a1);
  CfdException::CfdException
            (this_00,error_code,(string *)CONCAT17(uVar1,CONCAT16(bVar2,in_stack_ffffffffffffff40)))
  ;
  __cxa_throw(uVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey::Privkey(
    const ByteData &byte_data, NetType net_type, bool is_compressed)
    : data_(byte_data), is_compressed_(is_compressed), net_type_(net_type) {
  if (!IsValid(data_.GetBytes())) {
    warn(CFD_LOG_SOURCE, "Invalid Privkey data. hex={}.", data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data.");
  }
}